

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphbuilderadapter.cpp
# Opt level: O2

void __thiscall YAML::GraphBuilderAdapter::OnSequenceEnd(GraphBuilderAdapter *this)

{
  void *pNode;
  _Elt_pointer pCVar1;
  
  pCVar1 = (this->m_containers).c.
           super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pCVar1 == (this->m_containers).c.
                super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar1 = (this->m_containers).c.
             super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  pNode = pCVar1[-1].pContainer;
  std::
  deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
  ::pop_back(&(this->m_containers).c);
  DispositionNode(this,pNode);
  return;
}

Assistant:

void GraphBuilderAdapter::OnSequenceEnd() {
  void *pSequence = m_containers.top().pContainer;
  m_containers.pop();

  DispositionNode(pSequence);
}